

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O3

void __thiscall
HSimplexNla::setPointers
          (HSimplexNla *this,HighsLp *for_lp,HighsSparseMatrix *factor_a_matrix,
          HighsInt *basic_index,HighsOptions *options,HighsTimer *timer,
          HighsSimplexAnalysis *analysis)

{
  this->lp_ = for_lp;
  this->scale_ = (HighsScale *)0x0;
  if (((for_lp->scale_).has_scaling == true) && (for_lp->is_scaled_ == false)) {
    this->scale_ = &for_lp->scale_;
  }
  if (factor_a_matrix != (HighsSparseMatrix *)0x0) {
    HFactor::setupMatrix(&this->factor_,factor_a_matrix);
  }
  if (basic_index != (HighsInt *)0x0) {
    this->basic_index_ = basic_index;
  }
  if (options != (HighsOptions *)0x0) {
    this->options_ = options;
  }
  if (timer != (HighsTimer *)0x0) {
    this->timer_ = timer;
  }
  if (analysis != (HighsSimplexAnalysis *)0x0) {
    this->analysis_ = analysis;
  }
  return;
}

Assistant:

void HSimplexNla::setPointers(const HighsLp* for_lp,
                              const HighsSparseMatrix* factor_a_matrix,
                              HighsInt* basic_index,
                              const HighsOptions* options, HighsTimer* timer,
                              HighsSimplexAnalysis* analysis) {
  this->setLpAndScalePointers(for_lp);
  if (factor_a_matrix) factor_.setupMatrix(factor_a_matrix);
  if (basic_index) basic_index_ = basic_index;
  if (options) options_ = options;
  if (timer) timer_ = timer;
  if (analysis) analysis_ = analysis;
}